

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O3

bool OpenMD::invertMatrix<OpenMD::DynamicRectMatrix<double>>
               (DynamicRectMatrix<double> *A,DynamicRectMatrix<double> *AI,uint size,int *tmp1Size,
               ElemPoinerType tmp2Size)

{
  uint uVar1;
  double **ppdVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = A->nrow_;
  bVar3 = false;
  bVar4 = false;
  if ((((uVar1 == size) && (bVar4 = bVar3, uVar1 == A->ncol_)) && (uVar1 == AI->nrow_)) &&
     (A->ncol_ == AI->ncol_)) {
    iVar5 = LUFactorLinearSystem<OpenMD::DynamicRectMatrix<double>>(A,tmp1Size,size,tmp2Size);
    if (iVar5 == 0) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
      if (size != 0) {
        uVar8 = (ulong)size;
        uVar7 = 0;
        do {
          memset(tmp2Size,0,uVar8 * 8);
          tmp2Size[uVar7] = 1.0;
          LUSolveLinearSystem<OpenMD::DynamicRectMatrix<double>>(A,tmp1Size,tmp2Size,size);
          ppdVar2 = AI->data_;
          uVar6 = 0;
          do {
            ppdVar2[uVar6][uVar7] = tmp2Size[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar8);
        bVar4 = true;
      }
    }
  }
  return bVar4;
}

Assistant:

bool invertMatrix(MatrixType& A, MatrixType& AI, unsigned int size,
                    int* tmp1Size,
                    typename MatrixType::ElemPoinerType tmp2Size) {
    if (A.getNRow() != A.getNCol() || A.getNRow() != AI.getNRow() ||
        A.getNCol() != AI.getNCol() || A.getNRow() != size) {
      return false;
    }

    unsigned int i, j;

    //
    // Factor matrix; then begin solving for inverse one column at a time.
    // Note: tmp1Size returned value is used later, tmp2Size is just working
    // memory whose values are not used in LUSolveLinearSystem
    //
    if (LUFactorLinearSystem(A, tmp1Size, size, tmp2Size) == 0) {
      return false;
    }

    for (j = 0; j < size; ++j) {
      for (i = 0; i < size; ++i) {
        tmp2Size[i] = 0.0;
      }
      tmp2Size[j] = 1.0;

      LUSolveLinearSystem(A, tmp1Size, tmp2Size, size);

      for (i = 0; i < size; i++) {
        AI(i, j) = tmp2Size[i];
      }
    }

    return true;
  }